

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O2

void P_PoisonDamage(player_t *player,AActor *source,int damage,bool playPainSound)

{
  TObjPtr<AInventory> *obj;
  APlayerPawn *this;
  int iVar1;
  int iVar2;
  AInventory *pAVar3;
  FState *newstate;
  int iVar4;
  uint uVar5;
  double dVar6;
  uint local_4c;
  double local_48;
  FName local_40;
  FName local_3c;
  FName local_38;
  int local_34;
  
  if (player == (player_t *)0x0) {
    return;
  }
  this = player->mo;
  if ((this->super_AActor).health < 1) {
    return;
  }
  if (damage < 1000000) {
    if (((this->super_AActor).flags2.Value & 0x8000000) != 0) {
      return;
    }
    uVar5 = player->cheats;
    if ((uVar5 & 2) != 0) {
      return;
    }
  }
  else {
    uVar5 = player->cheats;
  }
  if ((uVar5 >> 0x19 & 1) != 0) {
    return;
  }
  local_48 = (double)damage;
  dVar6 = G_SkillProperty(SKILLP_DamageFactor);
  uVar5 = (uint)(dVar6 * local_48);
  obj = &(this->super_AActor).Inventory;
  local_4c = uVar5;
  pAVar3 = GC::ReadBarrier<AInventory>((AInventory **)obj);
  if (pAVar3 != (AInventory *)0x0) {
    pAVar3 = GC::ReadBarrier<AInventory>((AInventory **)obj);
    local_34 = (player->poisontype).Index;
    (*(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3c])
              (pAVar3,(ulong)uVar5,&local_34,&local_4c,1);
    uVar5 = local_4c;
  }
  local_38.Index = (player->poisontype).Index;
  local_4c = AActor::ApplyDamageFactor(&this->super_AActor,&local_38,uVar5);
  if ((int)local_4c < 1) {
    return;
  }
  if (((player->health <= (int)local_4c) &&
      (iVar1 = G_SkillProperty(SKILLP_AutoUseHealth), iVar1 != 0 || deathmatch.Value != 0)) &&
     (player->morphTics == 0)) {
    P_AutoUseHealth(player,(local_4c - player->health) + 1);
  }
  iVar1 = player->health - local_4c;
  player->health = iVar1;
  if (iVar1 < 0x32) {
    if (deathmatch.Value == 0) {
      P_AutoUseStrifeHealth(player);
      iVar1 = player->health;
    }
    if (iVar1 < 0) {
      player->health = 0;
    }
  }
  (player->attacker).field_0.p = source;
  iVar1 = (this->super_AActor).health;
  iVar4 = iVar1 - local_4c;
  (this->super_AActor).health = iVar4;
  if (iVar4 != 0 && (int)local_4c <= iVar1) goto LAB_004a1da3;
  if (((uint)player->cheats >> 0x1b & 1) == 0) {
    if ((999999 < (int)local_4c) || (((player->mo->super_AActor).flags7.Value & 0x40) == 0)) {
LAB_004a1d3c:
      if (((uint)player->cheats >> 0x18 & 1) == 0) {
        (this->super_AActor).special1 = local_4c;
        if (player->morphTics == 0) {
          iVar1 = (player->poisontype).Index;
          if ((iVar1 != 0x9f) || (iVar2 = 0x9f, (int)local_4c < 0x1a || iVar4 < -0x31)) {
            iVar2 = iVar1;
          }
          (this->super_AActor).DamageType.super_FName.Index = iVar2;
        }
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0xf])
                  (this,source,source,0);
        return;
      }
    }
  }
  else if (999999 < (int)local_4c) goto LAB_004a1d3c;
  (this->super_AActor).health = 1;
  player->health = 1;
LAB_004a1da3:
  if (playPainSound && ((byte)level.time & 0x3f) == 0) {
    local_3c.Index = 0x83;
    local_40.Index = (player->poisonpaintype).Index;
    newstate = AActor::FindState(&this->super_AActor,&local_3c,&local_40,false);
    if (newstate != (FState *)0x0) {
      AActor::SetState(&this->super_AActor,newstate,false);
    }
  }
  return;
}

Assistant:

void P_PoisonDamage (player_t *player, AActor *source, int damage,
	bool playPainSound)
{
	AActor *target;

	if (player == NULL)
	{
		return;
	}
	target = player->mo;
	if (target->health <= 0)
	{
		return;
	}
	if ((damage < TELEFRAG_DAMAGE && ((target->flags2 & MF2_INVULNERABLE) ||
		(player->cheats & CF_GODMODE))) || (player->cheats & CF_GODMODE2))
	{ // target is invulnerable
		return;
	}
	// Take half damage in trainer mode
	damage = int(damage * G_SkillProperty(SKILLP_DamageFactor));
	// Handle passive damage modifiers (e.g. PowerProtection)
	if (target->Inventory != NULL)
	{
		target->Inventory->ModifyDamage(damage, player->poisontype, damage, true);
	}
	// Modify with damage factors
	damage = target->ApplyDamageFactor(player->poisontype, damage);

	if (damage <= 0)
	{ // Damage was reduced to 0, so don't bother further.
		return;
	}
	if (damage >= player->health
		&& (G_SkillProperty(SKILLP_AutoUseHealth) || deathmatch)
		&& !player->morphTics)
	{ // Try to use some inventory health
		P_AutoUseHealth(player, damage - player->health+1);
	}
	player->health -= damage; // mirror mobj health here for Dave
	if (player->health < 50 && !deathmatch)
	{
		P_AutoUseStrifeHealth(player);
	}
	if (player->health < 0)
	{
		player->health = 0;
	}
	player->attacker = source;

	//
	// do the damage
	//
	target->health -= damage;
	if (target->health <= 0)
	{ // Death
		if ((((player->cheats & CF_BUDDHA) || (player->mo->flags7 & MF7_BUDDHA)) && damage < TELEFRAG_DAMAGE) || (player->cheats & CF_BUDDHA2))
		{ // [SP] Save the player... 
			player->health = target->health = 1;
		}
		else
		{
			target->special1 = damage;
			if (player && !player->morphTics)
			{ // Check for flame death
				if ((player->poisontype == NAME_Fire) && (target->health > -50) && (damage > 25))
				{
					target->DamageType = NAME_Fire;
				}
				else
				{
					target->DamageType = player->poisontype;
				}
			}
			target->Die(source, source);
			return;
		}
	}
	if (!(level.time&63) && playPainSound)
	{
		FState *painstate = target->FindState(NAME_Pain, player->poisonpaintype);
		if (painstate != NULL)
		{
			target->SetState(painstate);
		}
	}
/*
	if((P_Random() < target->info->painchance)
		&& !(target->flags&MF_SKULLFLY))
	{
		target->flags |= MF_JUSTHIT; // fight back!
		P_SetMobjState(target, target->info->painstate);
	}
*/
}